

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O3

ostream * std::operator<<(ostream *os,vector<char,_std::allocator<char>_> *vec)

{
  pointer pcVar1;
  ostream *poVar2;
  char *item;
  pointer pcVar3;
  char local_29;
  
  pcVar3 = (vec->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar1 = (vec->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pcVar3 != pcVar1) {
    do {
      local_29 = *pcVar3;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_29,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      pcVar3 = pcVar3 + 1;
    } while (pcVar3 != pcVar1);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const std::vector<T>& vec)
{
  for (auto const& item : vec)
  {
    os << item << ", ";
  }
  return os;
}